

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O1

bool __thiscall
FIntermissionActionScroller::ParseKey(FIntermissionActionScroller *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  char **ppcVar5;
  ScrollType ST [5];
  char *pcStack_68;
  int aiStack_60 [20];
  
  puVar4 = &DAT_006f08c0;
  ppcVar5 = &pcStack_68;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *ppcVar5 = (char *)*puVar4;
    puVar4 = puVar4 + 1;
    ppcVar5 = ppcVar5 + 1;
  }
  bVar1 = FScanner::Compare(sc,"ScrollDirection");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x101);
    iVar2 = FScanner::MatchString(sc,&pcStack_68,0x10);
    if (iVar2 != -1) {
      this->mScrollDir = aiStack_60[(long)iVar2 * 4];
    }
  }
  else {
    bVar1 = FScanner::Compare(sc,"InitialDelay");
    if (bVar1) {
      FScanner::MustGetToken(sc,0x3d);
      bVar1 = FScanner::CheckToken(sc,0x2d);
      if (bVar1) {
        FScanner::MustGetToken(sc,0x104);
        iVar2 = sc->Number;
      }
      else {
        FScanner::MustGetFloat(sc);
        iVar2 = (int)(sc->Float * 35.0);
      }
      this->mScrollDelay = iVar2;
    }
    else {
      bVar1 = FScanner::Compare(sc,"ScrollTime");
      if (bVar1) {
        FScanner::MustGetToken(sc,0x3d);
        bVar1 = FScanner::CheckToken(sc,0x2d);
        if (bVar1) {
          FScanner::MustGetToken(sc,0x104);
          iVar2 = sc->Number;
        }
        else {
          FScanner::MustGetFloat(sc);
          iVar2 = (int)(sc->Float * 35.0);
        }
        this->mScrollTime = iVar2;
      }
      else {
        bVar1 = FScanner::Compare(sc,"Background2");
        if (!bVar1) {
          bVar1 = FIntermissionAction::ParseKey(&this->super_FIntermissionAction,sc);
          return bVar1;
        }
        FScanner::MustGetToken(sc,0x3d);
        FScanner::MustGetToken(sc,0x102);
        FString::operator=(&this->mSecondPic,sc->String);
      }
    }
  }
  return true;
}

Assistant:

bool FIntermissionActionScroller::ParseKey(FScanner &sc)
{
	struct ScrollType
	{
		const char *Name;
		EScrollDir Type;
	}
	const ST[] = {
		{ "Left", SCROLL_Left },
		{ "Right", SCROLL_Right },
		{ "Up", SCROLL_Up },
		{ "Down", SCROLL_Down },
		{ NULL, SCROLL_Left }
	};

	if (sc.Compare("ScrollDirection"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		int v = sc.MatchString(&ST[0].Name, sizeof(ST[0]));
		if (v != -1) mScrollDir = ST[v].Type;
		return true;
	}
	else if (sc.Compare("InitialDelay"))
	{
		sc.MustGetToken('=');
		if (!sc.CheckToken('-'))
		{
			sc.MustGetFloat();
			mScrollDelay = int(sc.Float*TICRATE);
		}
		else
		{
			sc.MustGetToken(TK_IntConst);
			mScrollDelay = sc.Number;
		}
		return true;
	}
	else if (sc.Compare("ScrollTime"))
	{
		sc.MustGetToken('=');
		if (!sc.CheckToken('-'))
		{
			sc.MustGetFloat();
			mScrollTime = int(sc.Float*TICRATE);
		}
		else
		{
			sc.MustGetToken(TK_IntConst);
			mScrollTime = sc.Number;
		}
		return true;
	}
	else if (sc.Compare("Background2"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		mSecondPic = sc.String;
		return true;
	}
	else return Super::ParseKey(sc);
}